

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O2

int64_t get_sse(AV1_COMP *cpi,MACROBLOCK *x,int64_t *sse_y)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  uint sse;
  uint local_54;
  ulong *local_50;
  MB_MODE_INFO *local_48;
  AV1_COMP *local_40;
  long local_38;
  
  local_48 = *(x->e_mbd).mi;
  local_38 = 0x88;
  if (((cpi->common).seq_params)->monochrome == '\0') {
    local_38 = 0x198;
  }
  piVar1 = &(x->e_mbd).plane[0].subsampling_x;
  lVar3 = 0;
  lVar2 = 0;
  local_50 = (ulong *)sse_y;
  local_40 = cpi;
  while ((local_38 != lVar3 && ((lVar3 == 0 || ((x->e_mbd).is_chroma_ref == true))))) {
    bVar4 = local_50 != (ulong *)0x0;
    (*local_40->ppi->fn_ptr[av1_ss_size_lookup[local_48->bsize][*piVar1][piVar1[1]]].vf)
              (*(uint8_t **)((long)&x->plane[0].src.buf + lVar3),
               *(int *)((long)&x->plane[0].src.stride + lVar3),((buf_2d *)(piVar1 + 3))->buf,
               piVar1[9],&local_54);
    if (bVar4 && lVar3 == 0) {
      *local_50 = (ulong)local_54;
    }
    lVar2 = lVar2 + (ulong)local_54;
    lVar3 = lVar3 + 0x88;
    piVar1 = piVar1 + 0x28c;
  }
  return lVar2 << 4;
}

Assistant:

static int64_t get_sse(const uint8_t *a, int a_stride, const uint8_t *b,
                       int b_stride, int width, int height) {
  const int dw = width % 16;
  const int dh = height % 16;
  int64_t total_sse = 0;
  int x, y;

  if (dw > 0) {
    total_sse += encoder_sse(&a[width - dw], a_stride, &b[width - dw], b_stride,
                             dw, height);
  }

  if (dh > 0) {
    total_sse +=
        encoder_sse(&a[(height - dh) * a_stride], a_stride,
                    &b[(height - dh) * b_stride], b_stride, width - dw, dh);
  }

  for (y = 0; y < height / 16; ++y) {
    const uint8_t *pa = a;
    const uint8_t *pb = b;
    for (x = 0; x < width / 16; ++x) {
      total_sse += aom_sse(pa, a_stride, pb, b_stride, 16, 16);

      pa += 16;
      pb += 16;
    }

    a += 16 * a_stride;
    b += 16 * b_stride;
  }

  return total_sse;
}